

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyResourceState(RESOURCE_STATE States,COMMAND_QUEUE_TYPE QueueType,char *Name)

{
  char cVar1;
  COMMAND_QUEUE_TYPE CVar2;
  COMMAND_QUEUE_TYPE CVar3;
  char cVar4;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE Type_00;
  COMMAND_QUEUE_TYPE Type_01;
  Diligent *this;
  undefined7 in_register_00000031;
  RESOURCE_STATE State;
  COMMAND_QUEUE_TYPE CVar5;
  bool bVar6;
  string msg;
  undefined4 in_stack_ffffffffffffff78;
  Char *local_80;
  byte local_74 [4];
  string local_70;
  String local_50;
  
  local_74 = SUB84(CONCAT71(in_register_00000031,QueueType),0);
  CVar5 = QueueType & COMMAND_QUEUE_TYPE_GRAPHICS;
  bVar6 = Name != (char *)0x0;
  CVar3 = QueueType & COMMAND_QUEUE_TYPE_COMPUTE;
  cVar1 = CVar5 == COMMAND_QUEUE_TYPE_GRAPHICS || bVar6;
  cVar4 = CVar3 == COMMAND_QUEUE_TYPE_COMPUTE || bVar6;
  CVar2 = bVar6 | QueueType;
  bVar6 = true;
LAB_003e8163:
  if (States == RESOURCE_STATE_UNKNOWN) {
    return bVar6;
  }
  State = -States & States;
  States = States ^ State;
  this = (Diligent *)(ulong)CVar5;
  switch(State) {
  case RESOURCE_STATE_UNDEFINED:
    goto switchD_003e8259_caseD_1;
  case RESOURCE_STATE_VERTEX_BUFFER:
  case RESOURCE_STATE_INDEX_BUFFER:
switchD_003e8259_caseD_2:
    bVar6 = (bool)(bVar6 & CVar5 == COMMAND_QUEUE_TYPE_GRAPHICS);
    if (cVar1 == '\0') {
      local_80 = GetResourceStateFlagString(State);
      GetCommandQueueTypeString_abi_cxx11_(&local_50,this,Type);
      FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
                (&local_70,(Diligent *)" contains state ",(char (*) [17])&local_80,
                 (char **)" that is not supported in ",(char (*) [27])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5c709b,
                 (char (*) [9])
                 CONCAT17(cVar1,CONCAT16(CVar3,CONCAT15(cVar4,CONCAT14(CVar2,
                                                  in_stack_ffffffffffffff78)))));
      std::__cxx11::string::~string((string *)&local_50);
      DebugAssertionFailed
                (local_70._M_dataplus._M_p,"VerifyResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x197);
      break;
    }
    goto LAB_003e8163;
  case RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
  case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_UNDEFINED:
  case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER:
  case RESOURCE_STATE_CONSTANT_BUFFER|RESOURCE_STATE_VERTEX_BUFFER|RESOURCE_STATE_UNDEFINED:
switchD_003e8259_caseD_3:
    FormatString<char[26]>(&local_70,(char (*) [26])"Unexpected resource state");
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"VerifyResourceState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x19c);
    std::__cxx11::string::~string((string *)&local_70);
    goto LAB_003e8163;
  case RESOURCE_STATE_CONSTANT_BUFFER:
    goto switchD_003e8259_caseD_4;
  default:
    if (State == RESOURCE_STATE_RENDER_TARGET) goto switchD_003e8259_caseD_2;
    if (State == RESOURCE_STATE_UNORDERED_ACCESS) goto switchD_003e8259_caseD_4;
    if ((State == RESOURCE_STATE_DEPTH_WRITE) || (State == RESOURCE_STATE_DEPTH_READ))
    goto switchD_003e8259_caseD_2;
    if (State == RESOURCE_STATE_SHADER_RESOURCE) goto switchD_003e8259_caseD_4;
    if (State == RESOURCE_STATE_STREAM_OUT) goto switchD_003e8259_caseD_2;
    if (State == RESOURCE_STATE_INDIRECT_ARGUMENT) goto switchD_003e8259_caseD_4;
    if ((State != RESOURCE_STATE_COPY_DEST) && (State != RESOURCE_STATE_COPY_SOURCE)) {
      if ((State != RESOURCE_STATE_RESOLVE_DEST) &&
         (((State != RESOURCE_STATE_RESOLVE_SOURCE && (State != RESOURCE_STATE_INPUT_ATTACHMENT)) &&
          (State != RESOURCE_STATE_PRESENT)))) {
        if (((State == RESOURCE_STATE_BUILD_AS_READ) || (State == RESOURCE_STATE_BUILD_AS_WRITE)) ||
           (State == RESOURCE_STATE_RAY_TRACING)) goto switchD_003e8259_caseD_4;
        if (State != RESOURCE_STATE_MAX_BIT) {
          if (State != RESOURCE_STATE_COMMON) goto switchD_003e8259_caseD_3;
          goto switchD_003e8259_caseD_1;
        }
      }
      goto switchD_003e8259_caseD_2;
    }
switchD_003e8259_caseD_1:
    bVar6 = (bool)(bVar6 & local_74[0]);
    if ((CVar2 & COMMAND_QUEUE_TYPE_TRANSFER) != COMMAND_QUEUE_TYPE_UNKNOWN) goto LAB_003e8163;
    local_80 = GetResourceStateFlagString(State);
    GetCommandQueueTypeString_abi_cxx11_(&local_50,this,Type_01);
    FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
              (&local_70,(Diligent *)" contains state ",(char (*) [17])&local_80,
               (char **)" that is not supported in ",(char (*) [27])&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5c709b,
               (char (*) [9])
               CONCAT17(cVar1,CONCAT16(CVar3,CONCAT15(cVar4,CONCAT14(CVar2,in_stack_ffffffffffffff78
                                                                    )))));
    std::__cxx11::string::~string((string *)&local_50);
    DebugAssertionFailed
              (local_70._M_dataplus._M_p,"VerifyResourceState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x177);
  }
  goto LAB_003e83ef;
switchD_003e8259_caseD_4:
  bVar6 = (bool)(bVar6 & CVar3 == COMMAND_QUEUE_TYPE_COMPUTE);
  if (cVar4 != '\0') goto LAB_003e8163;
  local_80 = GetResourceStateFlagString(State);
  GetCommandQueueTypeString_abi_cxx11_(&local_50,this,Type_00);
  FormatString<char[17],char_const*,char[27],std::__cxx11::string,char[9]>
            (&local_70,(Diligent *)" contains state ",(char (*) [17])&local_80,
             (char **)" that is not supported in ",(char (*) [27])&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5c709b,
             (char (*) [9])
             CONCAT17(cVar1,CONCAT16(CVar3,CONCAT15(cVar4,CONCAT14(CVar2,in_stack_ffffffffffffff78))
                                    )));
  std::__cxx11::string::~string((string *)&local_50);
  DebugAssertionFailed
            (local_70._M_dataplus._M_p,"VerifyResourceState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
             ,0x185);
LAB_003e83ef:
  std::__cxx11::string::~string((string *)&local_70);
  bVar6 = false;
  goto LAB_003e8163;
}

Assistant:

bool VerifyResourceState(RESOURCE_STATE States, COMMAND_QUEUE_TYPE QueueType, const char* Name)
{
    QueueType &= COMMAND_QUEUE_TYPE_PRIMARY_MASK;

    bool Result = true;
    while (States != 0)
    {
        RESOURCE_STATE State = ExtractLSB(States);

        static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "Please update the switch below to handle the new resource state");
        switch (State)
        {
            case RESOURCE_STATE_UNDEFINED:
            case RESOURCE_STATE_COPY_DEST:
            case RESOURCE_STATE_COPY_SOURCE:
            case RESOURCE_STATE_COMMON:
                if ((QueueType & COMMAND_QUEUE_TYPE_TRANSFER) != COMMAND_QUEUE_TYPE_TRANSFER)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            case RESOURCE_STATE_CONSTANT_BUFFER:
            case RESOURCE_STATE_UNORDERED_ACCESS:
            case RESOURCE_STATE_SHADER_RESOURCE:
            case RESOURCE_STATE_INDIRECT_ARGUMENT:
            case RESOURCE_STATE_BUILD_AS_READ:
            case RESOURCE_STATE_BUILD_AS_WRITE:
            case RESOURCE_STATE_RAY_TRACING:
                if ((QueueType & COMMAND_QUEUE_TYPE_COMPUTE) != COMMAND_QUEUE_TYPE_COMPUTE)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            case RESOURCE_STATE_VERTEX_BUFFER:
            case RESOURCE_STATE_INDEX_BUFFER:
            case RESOURCE_STATE_RENDER_TARGET:
            case RESOURCE_STATE_DEPTH_WRITE:
            case RESOURCE_STATE_DEPTH_READ:
            case RESOURCE_STATE_STREAM_OUT:
            case RESOURCE_STATE_RESOLVE_DEST:
            case RESOURCE_STATE_RESOLVE_SOURCE:
            case RESOURCE_STATE_INPUT_ATTACHMENT:
            case RESOURCE_STATE_PRESENT:
            case RESOURCE_STATE_SHADING_RATE:
                if ((QueueType & COMMAND_QUEUE_TYPE_GRAPHICS) != COMMAND_QUEUE_TYPE_GRAPHICS)
                {
                    Result = false;
                    CHECK_PARAMETER(Name, " contains state ", GetResourceStateFlagString(State), " that is not supported in ", GetCommandQueueTypeString(QueueType), " context");
                }
                break;

            default:
                UNEXPECTED("Unexpected resource state");
                break;
        }
    }
    return Result;
}